

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManReader.cpp
# Opt level: O2

void __thiscall adios2::core::engine::DataManReader::RequestThread(DataManReader *this)

{
  DataManSerializer *this_00;
  DataManMonitor *this_01;
  pointer pcVar1;
  json_value jVar2;
  reference pvVar3;
  long lVar4;
  size_t step;
  size_t step_00;
  unsigned_long *timeStamp;
  _Rb_tree_header *p_Var5;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  jmsg;
  shared_ptr<std::vector<char,_std::allocator<char>_>_> buffer;
  __shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2> local_98;
  ZmqReqRep *local_88;
  pointer local_80;
  string request;
  _Any_data local_58;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_88 = &this->m_Requester;
  this_00 = &this->m_Serializer;
  this_01 = &this->m_Monitor;
  do {
    if (((this->m_RequesterThreadActive)._M_base._M_i & 1U) == 0) {
      return;
    }
    std::__cxx11::string::string((string *)&request,"Step",(allocator *)&jmsg);
    zmq::ZmqReqRep::Request((ZmqReqRep *)&buffer,(char *)local_88,(size_t)request._M_dataplus._M_p);
    if (buffer.
        super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != (element_type *)0x0) {
      local_80 = ((buffer.
                   super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      pcVar1 = ((buffer.
                 super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      if (pcVar1 != local_80) {
        if ((ulong)((long)pcVar1 - (long)local_80) < 0x40) {
          local_58._M_unused._M_object = (void *)0x0;
          local_58._8_8_ = 0;
          local_48 = 0;
          uStack_40 = 0;
          nlohmann::
          basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
          ::parse<char*>((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                          *)&jmsg,&local_80,(parser_callback_t *)&local_58,true,false);
          std::_Function_base::~_Function_base((_Function_base *)&local_58);
          pvVar3 = nlohmann::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                               *)&jmsg,"FinalStep");
          lVar4 = nlohmann::
                  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  ::get_impl<long,_0>(pvVar3);
          LOCK();
          (this->m_FinalStep).super___atomic_base<long>._M_i = lVar4;
          UNLOCK();
          nlohmann::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
          ::~basic_json(&jmsg);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&buffer.
                      super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount);
          std::__cxx11::string::~string((string *)&request);
          return;
        }
        std::__shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr(&local_98,
                     &buffer.
                      super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    );
        adios2::format::DataManSerializer::PutPack(this_00,(VecPtr *)&local_98,this->m_Threading);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_98._M_refcount);
        if (this->m_MonitorActive == true) {
          step = adios2::format::DataManSerializer::GetCombiningSteps(this_00);
          DataManMonitor::SetCombiningSteps(this_01,step);
          step_00 = step * 2;
          if (step < 0x14) {
            step_00 = 0x28;
          }
          DataManMonitor::SetAverageSteps(this_01,step_00);
          adios2::format::DataManSerializer::GetTimeStamps
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&jmsg,this_00);
          jVar2 = jmsg.m_value;
          for (p_Var5 = (_Rb_tree_header *)jmsg._0_8_; p_Var5 != (_Rb_tree_header *)jVar2.object;
              p_Var5 = &(((_Rep_type *)&p_Var5->_M_header)->_M_impl).super__Rb_tree_header) {
            DataManMonitor::AddLatencyMilliseconds
                      (this_01,*(uint64_t *)&((_Rep_type *)&p_Var5->_M_header)->_M_impl);
          }
          std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                    ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&jmsg);
        }
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&buffer.
                super___shared_ptr<std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&request);
  } while( true );
}

Assistant:

void DataManReader::RequestThread()
{
    while (m_RequesterThreadActive)
    {
        std::string request = "Step";
        auto buffer = m_Requester.Request(request.data(), request.size());
        if (buffer != nullptr && buffer->size() > 0)
        {
            if (buffer->size() < 64)
            {
                try
                {
                    auto jmsg = nlohmann::json::parse(buffer->data());
                    m_FinalStep = jmsg["FinalStep"].get<int64_t>();
                    return;
                }
                catch (...)
                {
                }
            }
            m_Serializer.PutPack(buffer, m_Threading);
            if (m_MonitorActive)
            {
                size_t combiningSteps = m_Serializer.GetCombiningSteps();
                m_Monitor.SetCombiningSteps(combiningSteps);
                if (combiningSteps < 20)
                {
                    m_Monitor.SetAverageSteps(40);
                }
                else
                {
                    m_Monitor.SetAverageSteps(combiningSteps * 2);
                }
                auto timeStamps = m_Serializer.GetTimeStamps();
                for (const auto &timeStamp : timeStamps)
                {
                    m_Monitor.AddLatencyMilliseconds(timeStamp);
                }
            }
        }
    }
}